

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  
  uVar2 = (uint)pMem->flags;
  if ((pMem->flags & 0xd) == 0) {
    iVar1 = sqlite3Atoi64(pMem->z,(i64 *)pMem,pMem->n,pMem->enc);
    if (iVar1 == 0) {
      uVar2 = pMem->flags & 0x3e00 | 4;
    }
    else {
      dVar3 = sqlite3VdbeRealValue(pMem);
      (pMem->u).r = dVar3;
      pMem->flags = pMem->flags & 0x3e00 | 8;
      sqlite3VdbeIntegerAffinity(pMem);
      uVar2 = (uint)pMem->flags;
    }
  }
  pMem->flags = (u16)(uVar2 & 0xbfed);
  return uVar2 & 0xbfed;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))==0 ){
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    if( 0==sqlite3Atoi64(pMem->z, &pMem->u.i, pMem->n, pMem->enc) ){
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      pMem->u.r = sqlite3VdbeRealValue(pMem);
      MemSetTypeFlag(pMem, MEM_Real);
      sqlite3VdbeIntegerAffinity(pMem);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob|MEM_Zero);
  return SQLITE_OK;
}